

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O2

void __thiscall
InterpreterTestSuite_PC_NetworkSelectAnother_Test::TestBody
          (InterpreterTestSuite_PC_NetworkSelectAnother_Test *this)

{
  Registry *pRVar1;
  Status SVar2;
  bool bVar3;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char *expected_predicate_value;
  char *pcVar4;
  Status local_4f2;
  allocator local_4f1;
  allocator local_4f0;
  allocator local_4ef;
  allocator local_4ee;
  allocator local_4ed;
  allocator local_4ec;
  allocator local_4eb;
  allocator local_4ea;
  Status local_4e9;
  AssertionResult gtest_ar_1;
  Expression expr;
  string local_4b8;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_6;
  State local_428;
  State local_424;
  Value value;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_3d8;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_3b8;
  Network nwk;
  string local_338;
  UnixTime local_318;
  UnixTime local_310;
  string local_308;
  BorderRouter br;
  TestContext ctx;
  
  InterpreterTestSuite::TestContext::TestContext(&ctx);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,&ctx);
  nwk.mId.mId = 0;
  nwk.mDomainId.mId = 0;
  testing::internal::CmpHelperNE<ot::commissioner::persistent_storage::Registry*,decltype(nullptr)>
            ((internal *)&br,"ctx.mRegistry","nullptr",&ctx.mRegistry,(void **)&nwk);
  if ((char)br._vptr_BorderRouter == '\0') {
    testing::Message::Message((Message *)&nwk);
    if ((undefined8 *)CONCAT44(br.mNetworkId.mId,br.mId.mId) == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)CONCAT44(br.mNetworkId.mId,br.mId.mId);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&value,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x5c0,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&value,(Message *)&nwk);
    this_00 = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&br.mId;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
    if (nwk._0_8_ != 0) {
      (**(code **)(*(long *)nwk._0_8_ + 8))();
    }
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&br.mId);
    pRVar1 = ctx.mRegistry;
    std::__cxx11::string::string((string *)&nwk,"127.0.0.1",&local_4ea);
    local_3b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_3b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&value,"1.1",&local_4eb);
    ot::commissioner::BorderAgent::State::State(&local_424,0,0,0,0,0);
    std::__cxx11::string::string((string *)&gtest_ar_6,"net1",&local_4ec);
    std::__cxx11::string::string((string *)&expr,"",&local_4ed);
    std::__cxx11::string::string((string *)&gtest_ar_,"",&local_4ee);
    std::__cxx11::string::string((string *)&local_4b8,"",&local_4ef);
    local_3d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_3d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&local_338,"domain1",&local_4f0);
    pcVar4 = "";
    std::__cxx11::string::string((string *)&local_308,"",&local_4f1);
    ot::commissioner::UnixTime::UnixTime(&local_310,0);
    ot::commissioner::BorderAgent::BorderAgent
              ((BorderAgent *)&br,(string *)&nwk,0x4e21,(ByteArray *)&local_3b8,(string *)&value,
               local_424,(string *)&gtest_ar_6,0,(string *)&expr,(string *)&gtest_ar_,(Timestamp)0x0
               ,0,&local_4b8,(ByteArray *)&local_3d8,&local_338,'\0',0,&local_308,local_310,0xff);
    local_4e9 = ot::commissioner::persistent_storage::Registry::Add(pRVar1,(BorderAgent *)&br);
    local_4f2 = kSuccess;
    testing::internal::
    CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
              ((internal *)&gtest_ar_1,
               "ctx.mRegistry->Add(BorderAgent{\"127.0.0.1\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net1\", 0, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain1\", 0, 0, \"\", 0, 0xFF})"
               ,"RegistryStatus::kSuccess",&local_4e9,&local_4f2);
    ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&br);
    std::__cxx11::string::~string((string *)&local_308);
    std::__cxx11::string::~string((string *)&local_338);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_3d8);
    std::__cxx11::string::~string((string *)&local_4b8);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    std::__cxx11::string::~string((string *)&expr);
    std::__cxx11::string::~string((string *)&gtest_ar_6);
    std::__cxx11::string::~string((string *)&value);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_3b8);
    std::__cxx11::string::~string((string *)&nwk);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&br);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar4 = *(char **)gtest_ar_1.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&nwk,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                 ,0x5c4,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&nwk,(Message *)&br);
      this_00 = &gtest_ar_1.message_;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&nwk);
      if ((long *)CONCAT71(br._vptr_BorderRouter._1_7_,(char)br._vptr_BorderRouter) != (long *)0x0)
      {
        (**(code **)(*(long *)CONCAT71(br._vptr_BorderRouter._1_7_,(char)br._vptr_BorderRouter) + 8)
        )();
      }
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_1.message_);
      pRVar1 = ctx.mRegistry;
      std::__cxx11::string::string((string *)&nwk,"127.0.0.2",&local_4ea);
      local_3b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_3b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_3b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string((string *)&value,"1.1",&local_4eb);
      ot::commissioner::BorderAgent::State::State(&local_428,0,0,0,0,0);
      std::__cxx11::string::string((string *)&gtest_ar_6,"net2",&local_4ec);
      std::__cxx11::string::string((string *)&expr,"",&local_4ed);
      std::__cxx11::string::string((string *)&gtest_ar_,"",&local_4ee);
      std::__cxx11::string::string((string *)&local_4b8,"",&local_4ef);
      local_3d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_3d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_3d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string((string *)&local_338,"domain1",&local_4f0);
      pcVar4 = "";
      std::__cxx11::string::string((string *)&local_308,"",&local_4f1);
      ot::commissioner::UnixTime::UnixTime(&local_318,0);
      expected_predicate_value = (char *)(ulong)(uint)local_428;
      ot::commissioner::BorderAgent::BorderAgent
                ((BorderAgent *)&br,(string *)&nwk,0x4e22,(ByteArray *)&local_3b8,(string *)&value,
                 local_428,(string *)&gtest_ar_6,1,(string *)&expr,(string *)&gtest_ar_,
                 (Timestamp)0x0,0,&local_4b8,(ByteArray *)&local_3d8,&local_338,'\0',0,&local_308,
                 local_318,0xff);
      local_4e9 = ot::commissioner::persistent_storage::Registry::Add(pRVar1,(BorderAgent *)&br);
      local_4f2 = kSuccess;
      testing::internal::
      CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                ((internal *)&gtest_ar_1,
                 "ctx.mRegistry->Add(BorderAgent{\"127.0.0.2\", 20002, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net2\", 1, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain1\", 0, 0, \"\", 0, 0xFF})"
                 ,"RegistryStatus::kSuccess",&local_4e9,&local_4f2);
      ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&br);
      std::__cxx11::string::~string((string *)&local_308);
      std::__cxx11::string::~string((string *)&local_338);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_3d8);
      std::__cxx11::string::~string((string *)&local_4b8);
      std::__cxx11::string::~string((string *)&gtest_ar_);
      std::__cxx11::string::~string((string *)&expr);
      std::__cxx11::string::~string((string *)&gtest_ar_6);
      std::__cxx11::string::~string((string *)&value);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_3b8);
      std::__cxx11::string::~string((string *)&nwk);
      if (gtest_ar_1.success_ != false) {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_1.message_);
        ot::commissioner::persistent_storage::BorderRouter::BorderRouter(&br);
        ot::commissioner::persistent_storage::NetworkId::NetworkId(&nwk.mId,0);
        br.mNetworkId = nwk.mId;
        SVar2 = ot::commissioner::persistent_storage::Registry::SetCurrentNetwork(ctx.mRegistry,&br)
        ;
        value.mError.mCode = CONCAT31(value.mError.mCode._1_3_,SVar2);
        gtest_ar_6._0_4_ = gtest_ar_6._0_4_ & 0xffffff00;
        testing::internal::
        CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                  ((internal *)&nwk,"ctx.mRegistry->SetCurrentNetwork(br)",
                   "RegistryStatus::kSuccess",(Status *)&value,&gtest_ar_6.success_);
        if ((char)nwk.mId.mId == '\0') {
          testing::Message::Message((Message *)&value);
          if (nwk.mName._M_dataplus._M_p == (pointer)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = *(char **)nwk.mName._M_dataplus._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_6,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                     ,0x5cb,pcVar4);
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&value);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
          if ((long *)CONCAT44(value.mError._4_4_,value.mError.mCode) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(value.mError._4_4_,value.mError.mCode) + 8))();
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&nwk.mName);
        }
        else {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&nwk.mName);
          ot::commissioner::persistent_storage::Network::Network(&nwk);
          bVar3 = (bool)ot::commissioner::persistent_storage::Registry::GetCurrentNetwork
                                  (ctx.mRegistry,&nwk);
          gtest_ar_6.success_ = bVar3;
          expr.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)((ulong)expr.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
          testing::internal::
          CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                    ((internal *)&value,"ctx.mRegistry->GetCurrentNetwork(nwk)",
                     "RegistryStatus::kSuccess",&gtest_ar_6.success_,(Status *)&expr);
          if ((undefined1)value.mError.mCode == kNone) {
            testing::Message::Message((Message *)&gtest_ar_6);
            if (value.mError.mMessage._M_dataplus._M_p == (pointer)0x0) {
              pcVar4 = "";
            }
            else {
              pcVar4 = *(char **)value.mError.mMessage._M_dataplus._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&expr,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                       ,0x5ce,pcVar4);
            testing::internal::AssertHelper::operator=((AssertHelper *)&expr,(Message *)&gtest_ar_6)
            ;
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&expr);
            if ((long *)CONCAT44(gtest_ar_6._4_4_,gtest_ar_6._0_4_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT44(gtest_ar_6._4_4_,gtest_ar_6._0_4_) + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&value.mError.mMessage);
          gtest_ar_6.success_ = false;
          gtest_ar_6._1_3_ = 0;
          testing::internal::CmpHelperEQ<unsigned_int,int>
                    ((internal *)&value,"nwk.mId.mId","0",(uint *)&nwk,(int *)&gtest_ar_6);
          if ((undefined1)value.mError.mCode == kNone) {
            testing::Message::Message((Message *)&gtest_ar_6);
            if (value.mError.mMessage._M_dataplus._M_p == (pointer)0x0) {
              pcVar4 = "";
            }
            else {
              pcVar4 = *(char **)value.mError.mMessage._M_dataplus._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&expr,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                       ,0x5cf,pcVar4);
            testing::internal::AssertHelper::operator=((AssertHelper *)&expr,(Message *)&gtest_ar_6)
            ;
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&expr);
            if ((long *)CONCAT44(gtest_ar_6._4_4_,gtest_ar_6._0_4_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT44(gtest_ar_6._4_4_,gtest_ar_6._0_4_) + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&value.mError.mMessage);
          expr.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          expr.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          expr.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          value.mError.mCode = kNone;
          value.mError.mMessage._M_dataplus._M_p = (pointer)&value.mError.mMessage.field_2;
          value.mError.mMessage._M_string_length = 0;
          value.mError.mMessage.field_2._M_local_buf[0] = '\0';
          value.mData._M_dataplus._M_p = (pointer)&value.mData.field_2;
          value.mData._M_string_length = 0;
          value.mData.field_2._M_local_buf[0] = '\0';
          std::__cxx11::string::string
                    ((string *)&gtest_ar_6,"Network select 1",(allocator *)&local_4b8);
          ot::commissioner::Interpreter::ParseExpression
                    ((Expression *)&gtest_ar_,&ctx.mInterpreter,(string *)&gtest_ar_6);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_move_assign(&expr,&gtest_ar_);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&gtest_ar_);
          std::__cxx11::string::~string((string *)&gtest_ar_6);
          ot::commissioner::Interpreter::Eval((Value *)&gtest_ar_6,&ctx.mInterpreter,&expr);
          ot::commissioner::Interpreter::Value::operator=(&value,(Value *)&gtest_ar_6);
          ot::commissioner::Interpreter::Value::~Value((Value *)&gtest_ar_6);
          bVar3 = ot::commissioner::Interpreter::Value::HasNoError(&value);
          gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          gtest_ar_.success_ = bVar3;
          if (!bVar3) {
            testing::Message::Message((Message *)&local_4b8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar_6,(internal *)&gtest_ar_,(AssertionResult *)0x27400f,
                       "false","true",expected_predicate_value);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_338,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                       ,0x5d6,(char *)CONCAT44(gtest_ar_6._4_4_,gtest_ar_6._0_4_));
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_338,(Message *)&local_4b8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
            std::__cxx11::string::~string((string *)&gtest_ar_6);
            if ((long *)CONCAT71(local_4b8._M_dataplus._M_p._1_7_,local_4b8._M_dataplus._M_p._0_1_)
                != (long *)0x0) {
              (**(code **)(*(long *)CONCAT71(local_4b8._M_dataplus._M_p._1_7_,
                                             local_4b8._M_dataplus._M_p._0_1_) + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
          gtest_ar_.success_ =
               (bool)ot::commissioner::persistent_storage::Registry::GetCurrentNetwork
                               (ctx.mRegistry,&nwk);
          local_4b8._M_dataplus._M_p._0_1_ = 0;
          testing::internal::
          CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                    ((internal *)&gtest_ar_6,"ctx.mRegistry->GetCurrentNetwork(nwk)",
                     "RegistryStatus::kSuccess",&gtest_ar_.success_,(Status *)&local_4b8);
          if (gtest_ar_6.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar_);
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar_6.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl ==
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar4 = "";
            }
            else {
              pcVar4 = *(char **)gtest_ar_6.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_4b8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                       ,0x5d7,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_4b8,(Message *)&gtest_ar_);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4b8);
            if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_6.message_);
          gtest_ar_.success_ = true;
          gtest_ar_._1_3_ = 0;
          testing::internal::CmpHelperEQ<unsigned_int,int>
                    ((internal *)&gtest_ar_6,"nwk.mId.mId","1",(uint *)&nwk,(int *)&gtest_ar_);
          if (gtest_ar_6.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar_);
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar_6.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl ==
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar4 = "";
            }
            else {
              pcVar4 = *(char **)gtest_ar_6.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_4b8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                       ,0x5d8,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_4b8,(Message *)&gtest_ar_);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4b8);
            if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_6.message_);
          ot::commissioner::Interpreter::Value::~Value(&value);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&expr);
          ot::commissioner::persistent_storage::Network::~Network(&nwk);
        }
        ot::commissioner::persistent_storage::BorderRouter::~BorderRouter(&br);
        goto LAB_0015eeb0;
      }
      testing::Message::Message((Message *)&br);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar4 = *(char **)gtest_ar_1.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&nwk,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                 ,0x5c8,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&nwk,(Message *)&br);
      this_00 = &gtest_ar_1.message_;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&nwk);
      if ((long *)CONCAT71(br._vptr_BorderRouter._1_7_,(char)br._vptr_BorderRouter) != (long *)0x0)
      {
        (**(code **)(*(long *)CONCAT71(br._vptr_BorderRouter._1_7_,(char)br._vptr_BorderRouter) + 8)
        )();
      }
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(this_00);
LAB_0015eeb0:
  InterpreterTestSuite::TestContext::~TestContext(&ctx);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_NetworkSelectAnother)
{
    TestContext ctx;
    InitContext(ctx);

    ASSERT_NE(ctx.mRegistry, nullptr);
    ASSERT_EQ(ctx.mRegistry->Add(BorderAgent{"127.0.0.1", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                             "net1", 0, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain1", 0, 0,
                                             "", 0, 0xFF}),
              RegistryStatus::kSuccess);
    ASSERT_EQ(ctx.mRegistry->Add(BorderAgent{"127.0.0.2", 20002, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                             "net2", 1, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain1", 0, 0,
                                             "", 0, 0xFF}),
              RegistryStatus::kSuccess);
    BorderRouter br;
    br.mNetworkId = 0;
    ASSERT_EQ(ctx.mRegistry->SetCurrentNetwork(br), RegistryStatus::kSuccess);

    Network nwk;
    EXPECT_EQ(ctx.mRegistry->GetCurrentNetwork(nwk), RegistryStatus::kSuccess);
    EXPECT_EQ(nwk.mId.mId, 0);

    Interpreter::Expression expr;
    Interpreter::Value      value;

    expr  = ctx.mInterpreter.ParseExpression("Network select 1");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
    EXPECT_EQ(ctx.mRegistry->GetCurrentNetwork(nwk), RegistryStatus::kSuccess);
    EXPECT_EQ(nwk.mId.mId, 1);
}